

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
initPrograms(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this,
            SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"vert",&local_61);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  glu::VertexSource::VertexSource((VertexSource *)local_40,&this->m_vertShaderSource);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"frag",&local_61);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_40,&this->m_fragShaderSource);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void DrawTestCase<T>::initPrograms (vk::SourceCollections& programCollection) const
{
	programCollection.glslSources.add("vert") << glu::VertexSource(m_vertShaderSource);
	programCollection.glslSources.add("frag") << glu::FragmentSource(m_fragShaderSource);
}